

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O3

void __thiscall
oqpi::scheduler<concurrent_queue>::signalAvailableWorker
          (scheduler<concurrent_queue> *this,worker_base *w)

{
  code *pcVar1;
  bool bVar2;
  eAssertResult eVar3;
  task_handle hTask;
  pointer local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  do {
    waitForNextTask((scheduler<concurrent_queue> *)&stack0xffffffffffffffc0,(worker_base *)this);
    if (((this->running_)._M_base._M_i & 1U) == 0) {
LAB_00175f3c:
      bVar2 = false;
    }
    else {
      if (local_40 != (pointer)0x0) {
        task_handle::validate((task_handle *)&stack0xffffffffffffffc0);
        if (((ulong)local_40[4]._M_t.
                    super___uniq_ptr_impl<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_oqpi::worker_base_*,_std::default_delete<oqpi::worker_base>_>
                    .super__Head_base<0UL,_oqpi::worker_base_*,_false>._M_head_impl & 0x100) != 0) {
          task_handle::validate((task_handle *)&stack0xffffffffffffffc0);
          bVar2 = true;
          if (((ulong)local_40[4]._M_t.
                      super___uniq_ptr_impl<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_oqpi::worker_base_*,_std::default_delete<oqpi::worker_base>_>
                      .super__Head_base<0UL,_oqpi::worker_base_*,_false>._M_head_impl & 0x10000) ==
              0) {
            worker_base::assign(w,(task_handle *)&stack0xffffffffffffffc0);
            goto LAB_00175f3c;
          }
          goto LAB_00175f63;
        }
      }
      eVar3 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/scheduler.hpp"
                              ,0x129,"hTask.isValid() && hTask.isGrabbed()","");
      bVar2 = true;
      if (eVar3 == eAR_Retry) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
LAB_00175f63:
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void signalAvailableWorker(worker_base &w)
        {
            // Loop until we find a task to work on
            while (true)
            {
                // Grab the next task
                task_handle hTask = waitForNextTask(w);

                // We could have been waken up to stop
                if (!running_.load())
                {
                    return;
                }

                // Make sure it's runnable
                if (oqpi_ensure(hTask.isValid() && hTask.isGrabbed()))
                {
                    // Make sure it's not done (activeWait on groups can leave a task done without being grabbed)
                    if (!hTask.isDone())
                    {
                        // Assign it to the available worker
                        w.assign(std::move(hTask));

                        // We got a task! See ya!
                        break;
                    }
                }
            }
        }